

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.c
# Opt level: O3

sysbvm_tuple_t
sysbvm_ordinaryFunction_memoizedApply
          (sysbvm_context_t *context,sysbvm_tuple_t function_,size_t argumentCount,
          sysbvm_tuple_t *arguments,sysbvm_bitflags_t applicationFlags)

{
  _Bool _Var1;
  uint uVar2;
  size_t i;
  size_t sVar3;
  ulong uVar4;
  sysbvm_stackFrameGCRootsRecord_t argumentsRecord;
  sysbvm_tuple_t templateArguments [16];
  ulong *local_108;
  sysbvm_tuple_t local_100;
  sysbvm_tuple_t sStack_f8;
  sysbvm_tuple_t local_f0;
  sysbvm_stackFrameRecord_t local_e8;
  size_t local_d8;
  sysbvm_tuple_t *local_d0;
  sysbvm_stackFrameRecord_t local_c8;
  undefined8 local_b8;
  undefined1 *local_b0;
  ulong local_a8;
  undefined1 local_a0 [120];
  
  local_b0 = (undefined1 *)&local_108;
  local_100 = 0;
  sStack_f8 = 0;
  local_f0 = 0;
  local_c8.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_c8.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_c8._12_4_ = 0;
  local_b8 = 4;
  local_108 = (ulong *)function_;
  sysbvm_stackFrame_pushRecord(&local_c8);
  local_e8.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_e8.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_d8 = argumentCount;
  local_d0 = arguments;
  sysbvm_stackFrame_pushRecord(&local_e8);
  if (argumentCount < 2) {
    if (argumentCount == 1) {
      local_100 = *arguments;
    }
  }
  else {
    local_100 = sysbvm_array_create(context,argumentCount);
    sVar3 = 0;
    do {
      if ((local_100 & 0xf) == 0 && local_100 != 0) {
        *(sysbvm_tuple_t *)(local_100 + 0x10 + sVar3 * 8) = arguments[sVar3];
      }
      sVar3 = sVar3 + 1;
    } while (argumentCount != sVar3);
  }
  uVar4 = local_108[0xc];
  if (uVar4 == 0) {
    uVar4 = sysbvm_weakValueDictionary_create(context);
    local_108[0xc] = uVar4;
  }
  _Var1 = sysbvm_weakValueDictionary_find(context,uVar4,local_100,&local_f0);
  if (_Var1) {
    if (local_f0 == 0x5f) {
      sysbvm_error("Computing cyclic memoized value.");
    }
    sysbvm_stackFrame_popRecord(&local_e8);
    goto LAB_00112265;
  }
  sysbvm_weakValueDictionary_atPut(context,local_108[0xc],local_100,0x5f);
  sysbvm_weakValueDictionary_findAssociation(context,local_108[0xc],local_100,&sStack_f8);
  sysbvm_stackFrame_popRecord(&local_e8);
  if (((((ulong)local_108 & 0xf) == 0 && local_108 != (ulong *)0x0) &&
      (uVar4 = *local_108, (uVar4 & 0xf) == 0 && uVar4 != 0)) &&
     ((*(byte *)(uVar4 + 8) & 0x80) == 0)) {
    uVar4 = *(ulong *)(uVar4 + 0x70);
    if (uVar4 == 0 || (uVar4 & 0xf) != 0) {
      uVar2 = (uint)((long)uVar4 >> 4);
    }
    else {
      uVar2 = (uint)*(undefined8 *)(uVar4 + 0x10);
    }
    if ((uVar2 >> 0xc & 1) != 0) {
      uVar4 = local_108[5];
      if (uVar4 == 0 || (uVar4 & 0xf) != 0) {
        uVar2 = (uint)((long)uVar4 >> 4);
      }
      else {
        uVar2 = (uint)*(undefined8 *)(uVar4 + 0x10);
      }
      if ((uVar2 >> 10 & 1) != 0) {
        if (argumentCount + 1 < 0x11) {
          local_a8 = sStack_f8;
          if (argumentCount != 0) goto LAB_001122b7;
        }
        else {
          sysbvm_error_assertionFailure
                    (
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/lib/sysbvm/function.c:305: assertion failure: argumentCount + 1 <= SYSBVM_MAX_FUNCTION_ARGUMENTS"
                    );
LAB_001122b7:
          local_a8 = sStack_f8;
          memcpy(local_a0,arguments,argumentCount << 3);
        }
        arguments = &local_a8;
        argumentCount = argumentCount + 1;
      }
    }
  }
  local_f0 = sysbvm_ordinaryFunction_directApply
                       (context,(sysbvm_tuple_t)local_108,argumentCount,arguments,applicationFlags);
  if (((sStack_f8 & 0xf) == 0 && sStack_f8 != 0) && (0xf < *(uint *)(sStack_f8 + 0xc))) {
    *(sysbvm_tuple_t *)(sStack_f8 + 0x18) = local_f0;
  }
LAB_00112265:
  sysbvm_stackFrame_popRecord(&local_c8);
  return local_f0;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_ordinaryFunction_memoizedApply(sysbvm_context_t *context, sysbvm_tuple_t function_, size_t argumentCount, sysbvm_tuple_t *arguments, sysbvm_bitflags_t applicationFlags)
{
    struct {
        sysbvm_tuple_t function;
        sysbvm_tuple_t memoizationKey;
        sysbvm_tuple_t memoizationAssociation;
        sysbvm_tuple_t result;
    } gcFrame = {
        .function = function_
    };
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);

    sysbvm_stackFrameGCRootsRecord_t argumentsRecord = {
        .type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS,
        .rootCount = argumentCount,
        .roots = arguments
    };
    sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t*)&argumentsRecord);

    sysbvm_function_t **functionObject = (sysbvm_function_t**)&gcFrame.function;

    // Make the memoization lookup key.
    if(argumentCount > 1)
    {
        gcFrame.memoizationKey = sysbvm_array_create(context, argumentCount);
        for(size_t i = 0; i < argumentCount; ++i)
            sysbvm_array_atPut(gcFrame.memoizationKey, i , arguments[i]);
    }
    else if(argumentCount == 1)
    {
        gcFrame.memoizationKey = arguments[0];
    }

    // Find the result in the memoization table
    if(!(*functionObject)->memoizationTable)
        (*functionObject)->memoizationTable = sysbvm_weakValueDictionary_create(context);

    if(sysbvm_weakValueDictionary_find(context, (*functionObject)->memoizationTable, gcFrame.memoizationKey, &gcFrame.result))
    {
        if(gcFrame.result == SYSBVM_PENDING_MEMOIZATION_VALUE)
            sysbvm_error("Computing cyclic memoized value.");

        sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t*)&argumentsRecord);
        SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
        return gcFrame.result;
    }
    else
    {
        sysbvm_weakValueDictionary_atPut(context, (*functionObject)->memoizationTable, gcFrame.memoizationKey, SYSBVM_PENDING_MEMOIZATION_VALUE);
        sysbvm_weakValueDictionary_findAssociation(context, (*functionObject)->memoizationTable, gcFrame.memoizationKey, &gcFrame.memoizationAssociation);
    }

    // Apply the actual function.
    sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t*)&argumentsRecord);

    if(sysbvm_function_isTemplate(context, gcFrame.function))
    {
        SYSBVM_ASSERT(argumentCount + 1 <= SYSBVM_MAX_FUNCTION_ARGUMENTS);
        sysbvm_tuple_t templateArguments[SYSBVM_MAX_FUNCTION_ARGUMENTS];
        templateArguments[0] = gcFrame.memoizationAssociation;
        for(size_t i = 0; i < argumentCount; ++i)
            templateArguments[i + 1] = arguments[i];

        gcFrame.result = sysbvm_ordinaryFunction_directApply(context, gcFrame.function, argumentCount + 1, templateArguments, applicationFlags);
    }
    else
    {
        gcFrame.result = sysbvm_ordinaryFunction_directApply(context, gcFrame.function, argumentCount, arguments, applicationFlags);
    }

    // Store the result
    sysbvm_association_setValue(gcFrame.memoizationAssociation, gcFrame.result);
    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return gcFrame.result;
}